

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

mat4 * mat4_look_at(mat4 *__return_storage_ptr__,vec3 position,vec3 target,vec3 up)

{
  mat4 m1;
  undefined1 auVar1 [56];
  mat4 m2;
  long lVar2;
  vec3 vVar3;
  vec3 vVar4;
  vec3 vVar5;
  mat4 mat_1;
  mat4 mat;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 local_38;
  
  vVar3 = vec3_normalize(up);
  local_e8 = target.x;
  uStack_e4 = target.y;
  local_38 = position.x;
  vVar4.x = local_e8 - local_38;
  vVar4.y = uStack_e4 - position.y;
  vVar4.z = target.z - position.z;
  vVar4 = vec3_normalize(vVar4);
  vVar3 = vec3_cross(vVar4,vVar3);
  vVar3 = vec3_normalize(vVar3);
  vVar5 = vec3_cross(vVar3,vVar4);
  vVar5 = vec3_normalize(vVar5);
  lVar2 = (ulong)(uint)-position.y << 0x20;
  m2.m[0xb] = -position.z;
  m2.m[10] = 1.0;
  auVar1 = ZEXT4456(CONCAT440(-vVar4.z,CONCAT832(vVar4._0_8_ ^ 0x8000000080000000,
                                                 CONCAT428(0,CONCAT424(vVar5.z,CONCAT816(vVar5._0_8_
                                                                                         ,CONCAT412(
                                                  0,vVar3)))))));
  m1.m[0xe] = 0.0;
  m1.m[0xf] = 1.0;
  m1.m[0] = (float)auVar1._0_4_;
  m1.m[1] = (float)auVar1._4_4_;
  m1.m[2] = (float)auVar1._8_4_;
  m1.m[3] = (float)auVar1._12_4_;
  m1.m[4] = (float)auVar1._16_4_;
  m1.m[5] = (float)auVar1._20_4_;
  m1.m[6] = (float)auVar1._24_4_;
  m1.m[7] = (float)auVar1._28_4_;
  m1.m[8] = (float)auVar1._32_4_;
  m1.m[9] = (float)auVar1._36_4_;
  m1.m[10] = (float)auVar1._40_4_;
  m1.m[0xb] = (float)auVar1._44_4_;
  m1.m[0xc] = (float)auVar1._48_4_;
  m1.m[0xd] = (float)auVar1._52_4_;
  m2.m[2] = (float)(int)((ulong)(uint)-local_38 << 0x20);
  m2.m[3] = (float)(int)(((ulong)(uint)-local_38 << 0x20) >> 0x20);
  m2.m[0] = 1.0;
  m2.m[1] = 0.0;
  m2.m[4] = 0.0;
  m2.m[5] = 1.0;
  m2.m[6] = (float)(int)lVar2;
  m2.m[7] = (float)(int)((ulong)lVar2 >> 0x20);
  m2.m[8] = 0.0;
  m2.m[9] = 0.0;
  m2.m[0xc] = 0.0;
  m2.m[0xd] = 0.0;
  m2.m[0xe] = 0.0;
  m2.m[0xf] = 1.0;
  mat4_multiply(m1,m2);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_look_at(vec3 position, vec3 target, vec3 up) {
    vec3 up_p = vec3_normalize(up);
    vec3 f = vec3_normalize(vec3_subtract(target, position));
    vec3 s = vec3_normalize(vec3_cross(f, up_p));
    vec3 u = vec3_normalize(vec3_cross(s, f));

    mat4 M = mat4_create(
            s.x, s.y, s.z, 0.0,
            u.x, u.y, u.z, 0.0,
            -f.x, -f.y, -f.z, 0.0,
            0.0, 0.0, 0.0, 1.0);
    mat4 T = mat4_translation(vec3_scale(position, -1.0));

    return mat4_multiply(M, T);
}